

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O1

ProgramContext * __thiscall
deqp::gles2::Performance::ShaderCompilerLightCase::generateShaderData
          (ProgramContext *__return_storage_ptr__,ShaderCompilerLightCase *this,int measurementNdx)

{
  undefined4 uVar1;
  size_type sVar2;
  ProgramContext *pPVar3;
  uint uVar4;
  long *plVar5;
  undefined1 *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  int row;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  size_type *psVar9;
  long lVar10;
  undefined1 *puVar11;
  long lVar12;
  string *psVar13;
  long lVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  uint cacheAvoidanceID;
  int iVar16;
  LightType in_R8D;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 uVar17;
  Array<float,_16> a_1;
  Array<float,_16> a_3;
  Vector<float,_16> result;
  Array<float,_9> a_2;
  string nameSpec;
  undefined1 auStack_348 [8];
  ProgramContext *local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined1 local_2f8 [8];
  undefined8 uStack_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  undefined8 uStack_2c0;
  string local_2b8;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined1 local_278 [8];
  undefined8 uStack_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined1 local_238 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  int local_1fc;
  UniformSpec local_1f8;
  ios_base local_188 [268];
  LightType local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined4 local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar6 = auStack_348;
  cacheAvoidanceID = (this->super_ShaderCompilerCase).m_startHash;
  if ((this->super_ShaderCompilerCase).m_avoidCache == true) {
    uVar4 = ((uint)measurementNdx >> 0x10 ^ measurementNdx ^ 0x3d) * 9;
    uVar4 = (uVar4 >> 4 ^ uVar4) * 0x27d4eb2d;
    cacheAvoidanceID = cacheAvoidanceID ^ uVar4 ^ uVar4 >> 0xf;
  }
  getNameSpecialization_abi_cxx11_
            ((string *)(local_238 + 0x18),(Performance *)(ulong)cacheAvoidanceID,measurementNdx);
  (__return_storage_ptr__->vertShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->vertShaderSource).field_2;
  (__return_storage_ptr__->vertShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->vertShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->fragShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fragShaderSource).field_2;
  (__return_storage_ptr__->fragShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->fragShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_340 = __return_storage_ptr__;
  lightVertexTemplate_abi_cxx11_
            (&local_2b8,(Performance *)(ulong)(uint)this->m_numLights,(uint)this->m_isVertexCase,
             SUB41(this->m_lightType,0),in_R8D);
  specializeShaderSource(&local_1f8.name,&local_2b8,cacheAvoidanceID,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
    operator_delete(local_1f8.name._M_dataplus._M_p,local_1f8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  lightFragmentTemplate_abi_cxx11_
            (&local_2b8,(Performance *)(ulong)(uint)this->m_numLights,(uint)this->m_isVertexCase,
             SUB41(this->m_lightType,0),in_R8D);
  psVar13 = &local_2b8;
  specializeShaderSource(&local_1f8.name,psVar13,cacheAvoidanceID,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->fragShaderSource,(string *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
    operator_delete(local_1f8.name._M_dataplus._M_p,local_1f8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_2f8 = (undefined1  [8])0x0;
  uStack_2f0 = (pointer)0x0;
  local_2e8._M_allocated_capacity = 0;
  std::operator+(&local_338,"a_position",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_238 + 0x18));
  local_278 = (undefined1  [8])0xbf800000bf800000;
  uStack_270 = 0x3f80000000000000;
  local_78._M_dataplus._M_p = (pointer)0x3f800000bf800000;
  local_78._M_string_length = 0x3f80000000000000;
  local_50._M_dataplus._M_p = (pointer)0xbf8000003f800000;
  local_50._M_string_length = 0x3f80000000000000;
  local_238._0_8_ = &DAT_3f8000003f800000;
  local_238._8_8_ = (pointer)0x3f80000000000000;
  local_2b8._M_dataplus._M_p = (pointer)0x0;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_allocated_capacity = 0;
  local_2b8.field_2._8_8_ = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_288 = 0;
  uStack_280 = 0;
  lVar12 = 0;
  do {
    iVar16 = (int)lVar12;
    pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
    if (((iVar16 != 0) && (pbVar15 = &local_78, iVar16 != 1)) &&
       (pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
       iVar16 == 2)) {
      pbVar15 = &local_50;
    }
    uVar17 = *(undefined4 *)((long)&(pbVar15->_M_dataplus)._M_p + 4);
    sVar2 = pbVar15->_M_string_length;
    uVar1 = *(undefined4 *)((long)&pbVar15->_M_string_length + 4);
    *(undefined4 *)&(psVar13->_M_dataplus)._M_p = *(undefined4 *)&(pbVar15->_M_dataplus)._M_p;
    *(undefined4 *)((long)&(psVar13->_M_dataplus)._M_p + 4) = uVar17;
    *(int *)&psVar13->_M_string_length = (int)sVar2;
    *(undefined4 *)((long)&psVar13->_M_string_length + 4) = uVar1;
    lVar12 = lVar12 + 1;
    psVar13 = (string *)&psVar13->field_2;
  } while (lVar12 != 4);
  local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,local_338._M_dataplus._M_p,
             local_338._M_dataplus._M_p + local_338._M_string_length);
  local_1f8.value.m_data[0xb] = (float)local_288;
  local_1f8.value.m_data[0xc] = (float)((ulong)local_288 >> 0x20);
  local_1f8.value.m_data[0xd] = (float)uStack_280;
  local_1f8.value.m_data[0xe] = (float)((ulong)uStack_280 >> 0x20);
  local_1f8.value.m_data[7] = (float)local_298;
  local_1f8.value.m_data[8] = (float)((ulong)local_298 >> 0x20);
  local_1f8.value.m_data[9] = (float)uStack_290;
  local_1f8.value.m_data[10] = (float)((ulong)uStack_290 >> 0x20);
  local_1f8.value.m_data[3] = (float)local_2b8.field_2._M_allocated_capacity;
  local_1f8.value.m_data[4] = (float)((ulong)local_2b8.field_2._0_8_ >> 0x20);
  local_1f8.value.m_data[5] = (float)local_2b8.field_2._8_8_;
  local_1f8.value.m_data[6] = (float)((ulong)local_2b8.field_2._8_8_ >> 0x20);
  local_1f8.type = (Type)local_2b8._M_dataplus._M_p;
  local_1f8.value.m_data[0] = (float)((ulong)local_2b8._M_dataplus._M_p >> 0x20);
  local_1f8.value.m_data[1] = (float)local_2b8._M_string_length;
  local_1f8.value.m_data[2] = (float)(local_2b8._M_string_length >> 0x20);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_2f8,(AttribSpec *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
    operator_delete(local_1f8.name._M_dataplus._M_p,local_1f8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_338,"a_normal",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_238 + 0x18));
  local_278 = (undefined1  [8])0x0;
  uStack_270 = 0xbf800000;
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0xbf800000;
  local_50._M_dataplus._M_p = (pointer)0x0;
  local_50._M_string_length = 0xbf800000;
  local_238._0_8_ = (pointer)0x0;
  local_238._8_8_ = (pointer)0xbf800000;
  psVar13 = &local_2b8;
  local_2b8._M_dataplus._M_p = (pointer)0x0;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_allocated_capacity = 0;
  local_2b8.field_2._8_8_ = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_288 = 0;
  uStack_280 = 0;
  lVar12 = 0;
  do {
    iVar16 = (int)lVar12;
    pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
    if (((iVar16 != 0) && (pbVar15 = &local_78, iVar16 != 1)) &&
       (pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
       iVar16 == 2)) {
      pbVar15 = &local_50;
    }
    uVar17 = *(undefined4 *)((long)&(pbVar15->_M_dataplus)._M_p + 4);
    sVar2 = pbVar15->_M_string_length;
    uVar1 = *(undefined4 *)((long)&pbVar15->_M_string_length + 4);
    *(undefined4 *)&(psVar13->_M_dataplus)._M_p = *(undefined4 *)&(pbVar15->_M_dataplus)._M_p;
    *(undefined4 *)((long)&(psVar13->_M_dataplus)._M_p + 4) = uVar17;
    *(int *)&psVar13->_M_string_length = (int)sVar2;
    *(undefined4 *)((long)&psVar13->_M_string_length + 4) = uVar1;
    lVar12 = lVar12 + 1;
    psVar13 = (string *)&psVar13->field_2;
  } while (lVar12 != 4);
  local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,local_338._M_dataplus._M_p,
             local_338._M_dataplus._M_p + local_338._M_string_length);
  local_1f8.value.m_data[0xb] = (float)local_288;
  local_1f8.value.m_data[0xc] = (float)((ulong)local_288 >> 0x20);
  local_1f8.value.m_data[0xd] = (float)uStack_280;
  local_1f8.value.m_data[0xe] = (float)((ulong)uStack_280 >> 0x20);
  local_1f8.value.m_data[7] = (float)local_298;
  local_1f8.value.m_data[8] = (float)((ulong)local_298 >> 0x20);
  local_1f8.value.m_data[9] = (float)uStack_290;
  local_1f8.value.m_data[10] = (float)((ulong)uStack_290 >> 0x20);
  local_1f8.value.m_data[3] = (float)local_2b8.field_2._M_allocated_capacity;
  local_1f8.value.m_data[4] = (float)((ulong)local_2b8.field_2._0_8_ >> 0x20);
  local_1f8.value.m_data[5] = (float)local_2b8.field_2._8_8_;
  local_1f8.value.m_data[6] = (float)((ulong)local_2b8.field_2._8_8_ >> 0x20);
  local_1f8.type = (Type)local_2b8._M_dataplus._M_p;
  local_1f8.value.m_data[0] = (float)((ulong)local_2b8._M_dataplus._M_p >> 0x20);
  local_1f8.value.m_data[1] = (float)local_2b8._M_string_length;
  local_1f8.value.m_data[2] = (float)(local_2b8._M_string_length >> 0x20);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_2f8,(AttribSpec *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
    operator_delete(local_1f8.name._M_dataplus._M_p,local_1f8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  pbVar15 = &local_338;
  std::operator+(pbVar15,"a_texCoord0",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_238 + 0x18));
  local_278 = (undefined1  [8])0x0;
  uStack_270 = 0;
  local_78._M_dataplus._M_p = (pointer)0x3f800000;
  local_78._M_string_length = 0;
  local_50._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_50._M_string_length = 0;
  local_238._0_8_ = &DAT_3f8000003f800000;
  local_238._8_8_ = (pointer)0x0;
  psVar13 = &local_2b8;
  local_2b8._M_dataplus._M_p = (pointer)0x0;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_allocated_capacity = 0;
  local_2b8.field_2._8_8_ = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_288 = 0;
  uStack_280 = 0;
  lVar12 = 0;
  do {
    iVar16 = (int)lVar12;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
    if (((iVar16 != 0) && (pbVar7 = &local_78, iVar16 != 1)) &&
       (pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
       iVar16 == 2)) {
      pbVar7 = &local_50;
    }
    uVar17 = *(undefined4 *)((long)&(pbVar7->_M_dataplus)._M_p + 4);
    sVar2 = pbVar7->_M_string_length;
    uVar1 = *(undefined4 *)((long)&pbVar7->_M_string_length + 4);
    *(undefined4 *)&(psVar13->_M_dataplus)._M_p = *(undefined4 *)&(pbVar7->_M_dataplus)._M_p;
    *(undefined4 *)((long)&(psVar13->_M_dataplus)._M_p + 4) = uVar17;
    *(int *)&psVar13->_M_string_length = (int)sVar2;
    *(undefined4 *)((long)&psVar13->_M_string_length + 4) = uVar1;
    lVar12 = lVar12 + 1;
    psVar13 = (string *)&psVar13->field_2;
  } while (lVar12 != 4);
  local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,local_338._M_dataplus._M_p,
             local_338._M_dataplus._M_p + local_338._M_string_length);
  local_1f8.value.m_data[0xb] = (float)local_288;
  local_1f8.value.m_data[0xc] = (float)((ulong)local_288 >> 0x20);
  local_1f8.value.m_data[0xd] = (float)uStack_280;
  local_1f8.value.m_data[0xe] = (float)((ulong)uStack_280 >> 0x20);
  local_1f8.value.m_data[7] = (float)local_298;
  local_1f8.value.m_data[8] = (float)((ulong)local_298 >> 0x20);
  local_1f8.value.m_data[9] = (float)uStack_290;
  local_1f8.value.m_data[10] = (float)((ulong)uStack_290 >> 0x20);
  local_1f8.value.m_data[3] = (float)local_2b8.field_2._M_allocated_capacity;
  local_1f8.value.m_data[4] = (float)((ulong)local_2b8.field_2._0_8_ >> 0x20);
  local_1f8.value.m_data[5] = (float)local_2b8.field_2._8_8_;
  local_1f8.value.m_data[6] = (float)((ulong)local_2b8.field_2._8_8_ >> 0x20);
  local_1f8.type = (Type)local_2b8._M_dataplus._M_p;
  local_1f8.value.m_data[0] = (float)((ulong)local_2b8._M_dataplus._M_p >> 0x20);
  local_1f8.value.m_data[1] = (float)local_2b8._M_string_length;
  local_1f8.value.m_data[2] = (float)(local_2b8._M_string_length >> 0x20);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_2f8,(AttribSpec *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
    operator_delete(local_1f8.name._M_dataplus._M_p,local_1f8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  local_1f8.name._M_dataplus._M_p =
       (pointer)(local_340->vertexAttributes).
                super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_1f8.name._M_string_length =
       (size_type)
       (local_340->vertexAttributes).
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1f8.name.field_2._M_allocated_capacity =
       (size_type)
       (local_340->vertexAttributes).
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_340->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2f8;
  (local_340->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = uStack_2f0;
  (local_340->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2e8._M_allocated_capacity;
  local_2f8 = (undefined1  [8])0x0;
  uStack_2f0 = (pointer)0x0;
  local_2e8._M_allocated_capacity = 0;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
             *)&local_1f8);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
             *)local_2f8);
  local_1fc = this->m_numLights;
  local_7c = this->m_lightType;
  local_238._0_8_ = (pointer)0x0;
  local_238._8_8_ = (pointer)0x0;
  local_238._16_8_ = (pointer)0x0;
  std::operator+(&local_2b8,"u_material_ambientColor",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_238 + 0x18));
  local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,local_2b8._M_dataplus._M_p,
             local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
  local_1f8.type = TYPE_VEC3;
  local_1f8.value.m_data[0] = 0.5;
  local_1f8.value.m_data[1] = 0.7;
  local_1f8.value.m_data[2] = 0.9;
  local_1f8.value.m_data[3] = 0.0;
  local_1f8.value.m_data[4] = 0.0;
  local_1f8.value.m_data[5] = 0.0;
  local_1f8.value.m_data[6] = 0.0;
  local_1f8.value.m_data[7] = 0.0;
  local_1f8.value.m_data[8] = 0.0;
  local_1f8.value.m_data[9] = 0.0;
  local_1f8.value.m_data[10] = 0.0;
  local_1f8.value.m_data[0xb] = 0.0;
  local_1f8.value.m_data[0xc] = 0.0;
  local_1f8.value.m_data[0xd] = 0.0;
  local_1f8.value.m_data[0xe] = 0.0;
  local_1f8.value.m_data[0xf] = 0.0;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)local_238,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
    operator_delete(local_1f8.name._M_dataplus._M_p,
                    (ulong)(local_1f8.name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_2b8,"u_material_diffuseColor",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_238 + 0x18));
  local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,local_2b8._M_dataplus._M_p,
             local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
  local_1f8.type = TYPE_VEC4;
  local_1f8.value.m_data[0] = 0.3;
  local_1f8.value.m_data[1] = 0.4;
  local_1f8.value.m_data[2] = 0.5;
  local_1f8.value.m_data[3] = 1.0;
  local_1f8.value.m_data[4] = 0.0;
  local_1f8.value.m_data[5] = 0.0;
  local_1f8.value.m_data[6] = 0.0;
  local_1f8.value.m_data[7] = 0.0;
  local_1f8.value.m_data[8] = 0.0;
  local_1f8.value.m_data[9] = 0.0;
  local_1f8.value.m_data[10] = 0.0;
  local_1f8.value.m_data[0xb] = 0.0;
  local_1f8.value.m_data[0xc] = 0.0;
  local_1f8.value.m_data[0xd] = 0.0;
  local_1f8.value.m_data[0xe] = 0.0;
  local_1f8.value.m_data[0xf] = 0.0;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)local_238,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
    operator_delete(local_1f8.name._M_dataplus._M_p,
                    (ulong)(local_1f8.name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_2b8,"u_material_emissiveColor",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_238 + 0x18));
  local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,local_2b8._M_dataplus._M_p,
             local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
  local_1f8.type = TYPE_VEC3;
  local_1f8.value.m_data[0] = 0.7;
  local_1f8.value.m_data[1] = 0.2;
  local_1f8.value.m_data[2] = 0.2;
  local_1f8.value.m_data[3] = 0.0;
  local_1f8.value.m_data[4] = 0.0;
  local_1f8.value.m_data[5] = 0.0;
  local_1f8.value.m_data[6] = 0.0;
  local_1f8.value.m_data[7] = 0.0;
  local_1f8.value.m_data[8] = 0.0;
  local_1f8.value.m_data[9] = 0.0;
  local_1f8.value.m_data[10] = 0.0;
  local_1f8.value.m_data[0xb] = 0.0;
  local_1f8.value.m_data[0xc] = 0.0;
  local_1f8.value.m_data[0xd] = 0.0;
  local_1f8.value.m_data[0xe] = 0.0;
  local_1f8.value.m_data[0xf] = 0.0;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)local_238,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
    operator_delete(local_1f8.name._M_dataplus._M_p,
                    (ulong)(local_1f8.name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_2b8,"u_material_specularColor",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_238 + 0x18));
  local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,local_2b8._M_dataplus._M_p,
             local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
  local_1f8.type = TYPE_VEC3;
  local_1f8.value.m_data[0] = 0.2;
  local_1f8.value.m_data[1] = 0.6;
  local_1f8.value.m_data[2] = 1.0;
  local_1f8.value.m_data[3] = 0.0;
  local_1f8.value.m_data[4] = 0.0;
  local_1f8.value.m_data[5] = 0.0;
  local_1f8.value.m_data[6] = 0.0;
  local_1f8.value.m_data[7] = 0.0;
  local_1f8.value.m_data[8] = 0.0;
  local_1f8.value.m_data[9] = 0.0;
  local_1f8.value.m_data[10] = 0.0;
  local_1f8.value.m_data[0xb] = 0.0;
  local_1f8.value.m_data[0xc] = 0.0;
  local_1f8.value.m_data[0xd] = 0.0;
  local_1f8.value.m_data[0xe] = 0.0;
  local_1f8.value.m_data[0xf] = 0.0;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)local_238,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
    operator_delete(local_1f8.name._M_dataplus._M_p,
                    (ulong)(local_1f8.name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  pbVar7 = &local_2b8;
  std::operator+(pbVar7,"u_material_shininess",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_238 + 0x18));
  local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,local_2b8._M_dataplus._M_p,
             local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
  local_1f8.type = TYPE_FLOAT;
  lVar12 = 9;
  do {
    local_1f8.value.m_data[lVar12 + -9] = 0.8;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x19);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)local_238,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
    operator_delete(local_1f8.name._M_dataplus._M_p,
                    (ulong)(local_1f8.name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (0 < local_1fc) {
    iVar16 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::ostream::operator<<(&local_1f8,iVar16);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
      std::ios_base::~ios_base(local_188);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                     "u_light",&local_2b8);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_278);
      local_2f8 = (undefined1  [8])&local_2e8;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar8) {
        local_2e8._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_2e8._8_8_ = plVar5[3];
      }
      else {
        local_2e8._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_2f8 = (undefined1  [8])*plVar5;
      }
      uStack_2f0 = (pointer)plVar5[1];
      *plVar5 = (long)paVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append(local_2f8,local_238._24_8_);
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_338.field_2._M_allocated_capacity = *psVar9;
        local_338.field_2._8_8_ = plVar5[3];
      }
      else {
        local_338.field_2._M_allocated_capacity = *psVar9;
        local_338._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_338._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,local_338._M_dataplus._M_p,
                 local_338._M_dataplus._M_p + local_338._M_string_length);
      local_1f8.type = TYPE_VEC3;
      local_1f8.value.m_data[0] = 0.8;
      local_1f8.value.m_data[1] = 0.6;
      local_1f8.value.m_data[2] = 0.3;
      local_1f8.value.m_data[0xb] = 0.0;
      local_1f8.value.m_data[0xc] = 0.0;
      local_1f8.value.m_data[0xd] = 0.0;
      local_1f8.value.m_data[0xe] = 0.0;
      local_1f8.value.m_data[7] = 0.0;
      local_1f8.value.m_data[8] = 0.0;
      local_1f8.value.m_data[9] = 0.0;
      local_1f8.value.m_data[10] = 0.0;
      local_1f8.value.m_data[3] = 0.0;
      local_1f8.value.m_data[4] = 0.0;
      local_1f8.value.m_data[5] = 0.0;
      local_1f8.value.m_data[6] = 0.0;
      local_1f8.value.m_data[0xf] = 0.0;
      std::
      vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
      ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
                ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                  *)local_238,&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
        operator_delete(local_1f8.name._M_dataplus._M_p,
                        (ulong)(local_1f8.name.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != (undefined1  [8])&local_2e8) {
        operator_delete((void *)local_2f8,(ulong)(local_2e8._M_allocated_capacity + 1));
      }
      if (local_278 != (undefined1  [8])&local_268) {
        operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                     "u_light",&local_2b8);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_278);
      local_2f8 = (undefined1  [8])&local_2e8;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar8) {
        local_2e8._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_2e8._8_8_ = plVar5[3];
      }
      else {
        local_2e8._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_2f8 = (undefined1  [8])*plVar5;
      }
      uStack_2f0 = (pointer)plVar5[1];
      *plVar5 = (long)paVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append(local_2f8,local_238._24_8_);
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_338.field_2._M_allocated_capacity = *psVar9;
        local_338.field_2._8_8_ = plVar5[3];
      }
      else {
        local_338.field_2._M_allocated_capacity = *psVar9;
        local_338._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_338._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,local_338._M_dataplus._M_p,
                 local_338._M_dataplus._M_p + local_338._M_string_length);
      local_1f8.type = TYPE_VEC3;
      local_1f8.value.m_data[0] = 0.2;
      local_1f8.value.m_data[1] = 0.3;
      local_1f8.value.m_data[2] = 0.4;
      local_1f8.value.m_data[0xb] = 0.0;
      local_1f8.value.m_data[0xc] = 0.0;
      local_1f8.value.m_data[0xd] = 0.0;
      local_1f8.value.m_data[0xe] = 0.0;
      local_1f8.value.m_data[7] = 0.0;
      local_1f8.value.m_data[8] = 0.0;
      local_1f8.value.m_data[9] = 0.0;
      local_1f8.value.m_data[10] = 0.0;
      local_1f8.value.m_data[3] = 0.0;
      local_1f8.value.m_data[4] = 0.0;
      local_1f8.value.m_data[5] = 0.0;
      local_1f8.value.m_data[6] = 0.0;
      local_1f8.value.m_data[0xf] = 0.0;
      std::
      vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
      ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
                ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                  *)local_238,&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
        operator_delete(local_1f8.name._M_dataplus._M_p,
                        (ulong)(local_1f8.name.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != (undefined1  [8])&local_2e8) {
        operator_delete((void *)local_2f8,(ulong)(local_2e8._M_allocated_capacity + 1));
      }
      if (local_278 != (undefined1  [8])&local_268) {
        operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
      }
      if (local_7c == LIGHT_POINT) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_278,"u_light",&local_2b8);
        plVar5 = (long *)std::__cxx11::string::append((char *)local_278);
        local_2f8 = (undefined1  [8])&local_2e8;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 == paVar8) {
          local_2e8._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_2e8._8_8_ = plVar5[3];
        }
        else {
          local_2e8._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_2f8 = (undefined1  [8])*plVar5;
        }
        uStack_2f0 = (pointer)plVar5[1];
        *plVar5 = (long)paVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append(local_2f8,local_238._24_8_);
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_338.field_2._M_allocated_capacity = *psVar9;
          local_338.field_2._8_8_ = plVar5[3];
        }
        else {
          local_338.field_2._M_allocated_capacity = *psVar9;
          local_338._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_338._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,local_338._M_dataplus._M_p,
                   local_338._M_dataplus._M_p + local_338._M_string_length);
        local_1f8.type = TYPE_VEC4;
        local_1f8.value.m_data[0] = 1.0;
        local_1f8.value.m_data[1] = 0.6;
        local_1f8.value.m_data[2] = 0.3;
        local_1f8.value.m_data[3] = 0.2;
        local_1f8.value.m_data[0xc] = 0.0;
        local_1f8.value.m_data[0xd] = 0.0;
        local_1f8.value.m_data[0xe] = 0.0;
        local_1f8.value.m_data[0xf] = 0.0;
        local_1f8.value.m_data[8] = 0.0;
        local_1f8.value.m_data[9] = 0.0;
        local_1f8.value.m_data[10] = 0.0;
        local_1f8.value.m_data[0xb] = 0.0;
        local_1f8.value.m_data[4] = 0.0;
        local_1f8.value.m_data[5] = 0.0;
        local_1f8.value.m_data[6] = 0.0;
        local_1f8.value.m_data[7] = 0.0;
        std::
        vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
        ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
                  ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                    *)local_238,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
          operator_delete(local_1f8.name._M_dataplus._M_p,
                          (ulong)(local_1f8.name.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
        if (local_2f8 != (undefined1  [8])&local_2e8) {
          operator_delete((void *)local_2f8,(ulong)(local_2e8._M_allocated_capacity + 1));
        }
        if (local_278 != (undefined1  [8])&local_268) {
          operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_278,"u_light",&local_2b8);
        plVar5 = (long *)std::__cxx11::string::append((char *)local_278);
        local_2f8 = (undefined1  [8])&local_2e8;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 == paVar8) {
          local_2e8._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_2e8._8_8_ = plVar5[3];
        }
        else {
          local_2e8._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_2f8 = (undefined1  [8])*plVar5;
        }
        uStack_2f0 = (pointer)plVar5[1];
        *plVar5 = (long)paVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append(local_2f8,local_238._24_8_);
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_338.field_2._M_allocated_capacity = *psVar9;
          local_338.field_2._8_8_ = plVar5[3];
        }
        else {
          local_338.field_2._M_allocated_capacity = *psVar9;
          local_338._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_338._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,local_338._M_dataplus._M_p,
                   local_338._M_dataplus._M_p + local_338._M_string_length);
        local_1f8.type = TYPE_FLOAT;
        lVar12 = 9;
        do {
          local_1f8.value.m_data[lVar12 + -9] = 0.6;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x19);
        std::
        vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
        ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
                  ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                    *)local_238,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
          operator_delete(local_1f8.name._M_dataplus._M_p,
                          (ulong)(local_1f8.name.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
        if (local_2f8 != (undefined1  [8])&local_2e8) {
          operator_delete((void *)local_2f8,(ulong)(local_2e8._M_allocated_capacity + 1));
        }
        if (local_278 != (undefined1  [8])&local_268) {
          operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_278,"u_light",&local_2b8);
        plVar5 = (long *)std::__cxx11::string::append((char *)local_278);
        local_2f8 = (undefined1  [8])&local_2e8;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 == paVar8) {
          local_2e8._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_2e8._8_8_ = plVar5[3];
        }
        else {
          local_2e8._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_2f8 = (undefined1  [8])*plVar5;
        }
        uStack_2f0 = (pointer)plVar5[1];
        *plVar5 = (long)paVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append(local_2f8,local_238._24_8_);
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_338.field_2._M_allocated_capacity = *psVar9;
          local_338.field_2._8_8_ = plVar5[3];
        }
        else {
          local_338.field_2._M_allocated_capacity = *psVar9;
          local_338._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_338._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,local_338._M_dataplus._M_p,
                   local_338._M_dataplus._M_p + local_338._M_string_length);
        local_1f8.type = TYPE_FLOAT;
        lVar12 = 9;
        do {
          local_1f8.value.m_data[lVar12 + -9] = 0.5;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x19);
        std::
        vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
        ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
                  ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                    *)local_238,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
          operator_delete(local_1f8.name._M_dataplus._M_p,
                          (ulong)(local_1f8.name.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
        if (local_2f8 != (undefined1  [8])&local_2e8) {
          operator_delete((void *)local_2f8,(ulong)(local_2e8._M_allocated_capacity + 1));
        }
        if (local_278 != (undefined1  [8])&local_268) {
          operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_278,"u_light",&local_2b8);
        plVar5 = (long *)std::__cxx11::string::append((char *)local_278);
        local_2f8 = (undefined1  [8])&local_2e8;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 == paVar8) {
          local_2e8._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_2e8._8_8_ = plVar5[3];
        }
        else {
          local_2e8._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_2f8 = (undefined1  [8])*plVar5;
        }
        uStack_2f0 = (pointer)plVar5[1];
        *plVar5 = (long)paVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append(local_2f8,local_238._24_8_);
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_338.field_2._M_allocated_capacity = *psVar9;
          local_338.field_2._8_8_ = plVar5[3];
        }
        else {
          local_338.field_2._M_allocated_capacity = *psVar9;
          local_338._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_338._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,local_338._M_dataplus._M_p,
                   local_338._M_dataplus._M_p + local_338._M_string_length);
        local_1f8.type = TYPE_FLOAT;
        lVar12 = 9;
        do {
          local_1f8.value.m_data[lVar12 + -9] = 0.4;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x19);
        std::
        vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
        ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
                  ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                    *)local_238,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
          operator_delete(local_1f8.name._M_dataplus._M_p,
                          (ulong)(local_1f8.name.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
        if (local_2f8 != (undefined1  [8])&local_2e8) {
          operator_delete((void *)local_2f8,(ulong)(local_2e8._M_allocated_capacity + 1));
        }
        if (local_278 != (undefined1  [8])&local_268) {
          operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 != local_1fc);
  }
  __return_storage_ptr___00 =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8;
  std::operator+(__return_storage_ptr___00,"u_mvpMatrix",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_238 + 0x18));
  local_308 = 0;
  uStack_300 = 0;
  local_318 = 0;
  uStack_310 = 0;
  local_338.field_2._M_allocated_capacity = 0;
  local_338.field_2._8_8_ = 0;
  local_338._M_dataplus._M_p = (pointer)0x0;
  local_338._M_string_length = 0;
  lVar12 = 0;
  lVar10 = 0;
  do {
    lVar14 = 0;
    do {
      uVar17 = 0x3f800000;
      if (lVar12 != lVar14) {
        uVar17 = 0;
      }
      *(undefined4 *)((long)&(pbVar15->_M_dataplus)._M_p + lVar14) = uVar17;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x40);
    lVar10 = lVar10 + 1;
    pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&(pbVar15->_M_dataplus)._M_p + 4);
    lVar12 = lVar12 + 0x10;
  } while (lVar10 != 4);
  lVar12 = 0;
  do {
    puVar6 = puVar6 + 0x10;
    lVar10 = 0;
    do {
      *(undefined4 *)((long)&(pbVar7->_M_dataplus)._M_p + lVar10) = *(undefined4 *)(puVar6 + lVar10)
      ;
      lVar10 = lVar10 + 4;
    } while (lVar10 != 0x10);
    lVar12 = lVar12 + 1;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbVar7->field_2;
  } while (lVar12 != 4);
  local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,local_2f8,
             (char *)((long)local_2f8 + (long)(&uStack_2f0->value + -1) + 0x20));
  local_1f8.type = TYPE_MAT4;
  local_1f8.value.m_data[0] = SUB84(local_2b8._M_dataplus._M_p,0);
  local_1f8.value.m_data[1] = (float)((ulong)local_2b8._M_dataplus._M_p >> 0x20);
  local_1f8.value.m_data[2] = (float)local_2b8._M_string_length;
  local_1f8.value.m_data[3] = (float)(local_2b8._M_string_length >> 0x20);
  local_1f8.value.m_data[4] = (float)local_2b8.field_2._M_allocated_capacity;
  local_1f8.value.m_data[5] = (float)((ulong)local_2b8.field_2._0_8_ >> 0x20);
  local_1f8.value.m_data[6] = (float)local_2b8.field_2._8_8_;
  local_1f8.value.m_data[7] = (float)((ulong)local_2b8.field_2._8_8_ >> 0x20);
  local_1f8.value.m_data[8] = (float)local_298;
  local_1f8.value.m_data[9] = (float)((ulong)local_298 >> 0x20);
  local_1f8.value.m_data[10] = (float)uStack_290;
  local_1f8.value.m_data[0xb] = (float)((ulong)uStack_290 >> 0x20);
  local_1f8.value.m_data[0xc] = (float)local_288;
  local_1f8.value.m_data[0xd] = (float)((ulong)local_288 >> 0x20);
  local_1f8.value.m_data[0xe] = (float)uStack_280;
  local_1f8.value.m_data[0xf] = (float)((ulong)uStack_280 >> 0x20);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)local_238,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
    operator_delete(local_1f8.name._M_dataplus._M_p,
                    (ulong)(local_1f8.name.field_2._M_allocated_capacity + 1));
  }
  if (local_2f8 != (undefined1  [8])&local_2e8) {
    operator_delete((void *)local_2f8,(ulong)(local_2e8._M_allocated_capacity + 1));
  }
  pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
  std::operator+(pbVar15,"u_modelViewMatrix",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_238 + 0x18));
  pPVar3 = local_340;
  local_2c8 = 0.0;
  fStack_2c4 = 0.0;
  uStack_2c0 = 0;
  local_2d8 = 0.0;
  fStack_2d4 = 0.0;
  fStack_2d0 = 0.0;
  fStack_2cc = 0.0;
  local_2e8._M_allocated_capacity = 0;
  local_2e8._8_8_ = 0;
  local_2f8 = (undefined1  [8])0x0;
  uStack_2f0 = (pointer)0x0;
  lVar12 = 0;
  lVar10 = 0;
  do {
    lVar14 = 0;
    do {
      uVar17 = 0x3f800000;
      if (lVar12 != lVar14) {
        uVar17 = 0;
      }
      *(undefined4 *)((long)&(__return_storage_ptr___00->_M_dataplus)._M_p + lVar14) = uVar17;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x40);
    lVar10 = lVar10 + 1;
    __return_storage_ptr___00 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&(__return_storage_ptr___00->_M_dataplus)._M_p + 4);
    lVar12 = lVar12 + 0x10;
  } while (lVar10 != 4);
  pbVar7 = &local_338;
  puVar6 = local_2f8;
  lVar12 = 0;
  do {
    lVar10 = 0;
    do {
      *(undefined4 *)((long)&(pbVar7->_M_dataplus)._M_p + lVar10) = *(undefined4 *)(puVar6 + lVar10)
      ;
      lVar10 = lVar10 + 4;
    } while (lVar10 != 0x10);
    lVar12 = lVar12 + 1;
    puVar6 = puVar6 + 0x10;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbVar7->field_2;
  } while (lVar12 != 4);
  local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,local_278,(char *)((long)local_278 + uStack_270));
  local_1f8.type = TYPE_MAT4;
  local_1f8.value.m_data[0] = SUB84(local_338._M_dataplus._M_p,0);
  local_1f8.value.m_data[1] = (float)((ulong)local_338._M_dataplus._M_p >> 0x20);
  local_1f8.value.m_data[2] = (float)local_338._M_string_length;
  local_1f8.value.m_data[3] = (float)(local_338._M_string_length >> 0x20);
  local_1f8.value.m_data[4] = (float)local_338.field_2._M_allocated_capacity;
  local_1f8.value.m_data[5] = (float)((ulong)local_338.field_2._0_8_ >> 0x20);
  local_1f8.value.m_data[6] = (float)local_338.field_2._8_8_;
  local_1f8.value.m_data[7] = (float)((ulong)local_338.field_2._8_8_ >> 0x20);
  local_1f8.value.m_data[8] = (float)local_318;
  local_1f8.value.m_data[9] = (float)((ulong)local_318 >> 0x20);
  local_1f8.value.m_data[10] = (float)uStack_310;
  local_1f8.value.m_data[0xb] = (float)((ulong)uStack_310 >> 0x20);
  local_1f8.value.m_data[0xc] = (float)local_308;
  local_1f8.value.m_data[0xd] = (float)((ulong)local_308 >> 0x20);
  local_1f8.value.m_data[0xe] = (float)uStack_300;
  local_1f8.value.m_data[0xf] = (float)((ulong)uStack_300 >> 0x20);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)local_238,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
    operator_delete(local_1f8.name._M_dataplus._M_p,
                    (ulong)(local_1f8.name.field_2._M_allocated_capacity + 1));
  }
  if (local_278 != (undefined1  [8])&local_268) {
    operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
  }
  std::operator+(&local_50,"u_normalMatrix",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_238 + 0x18));
  pbVar7 = &local_78;
  local_78.field_2._M_allocated_capacity = 0;
  local_78.field_2._8_8_ = 0;
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  local_58 = 0;
  lVar12 = 0;
  lVar10 = 0;
  do {
    lVar14 = 0;
    do {
      uVar17 = 0x3f800000;
      if (lVar12 != lVar14) {
        uVar17 = 0;
      }
      *(undefined4 *)((long)&(pbVar7->_M_dataplus)._M_p + lVar14) = uVar17;
      lVar14 = lVar14 + 0xc;
    } while (lVar14 != 0x24);
    lVar10 = lVar10 + 1;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&(pbVar7->_M_dataplus)._M_p + 4);
    lVar12 = lVar12 + 0xc;
  } while (lVar10 != 3);
  pbVar7 = &local_78;
  lVar12 = 0;
  do {
    lVar10 = 0;
    do {
      *(undefined4 *)((long)&(pbVar15->_M_dataplus)._M_p + lVar10) =
           *(undefined4 *)((long)&(pbVar7->_M_dataplus)._M_p + lVar10);
      lVar10 = lVar10 + 4;
    } while (lVar10 != 0xc);
    lVar12 = lVar12 + 1;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&pbVar7->_M_string_length + 4);
    pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&pbVar15->_M_string_length + 4);
  } while (lVar12 != 3);
  fStack_2c4 = 0.0;
  uStack_2c0 = 0;
  fStack_2d4 = 0.0;
  fStack_2d0 = 0.0;
  fStack_2cc = 0.0;
  local_2c8 = 0.0;
  local_2f8._0_4_ = local_278._0_4_;
  local_2f8._4_4_ = local_278._4_4_;
  uStack_2f0._0_4_ = (float)uStack_270;
  uStack_2f0._4_4_ = uStack_270._4_4_;
  local_2e8._M_allocated_capacity._0_4_ = (undefined4)local_268._M_allocated_capacity;
  local_2e8._M_allocated_capacity._4_4_ = local_268._M_allocated_capacity._4_4_;
  local_2e8._8_4_ = (undefined4)local_268._8_8_;
  local_2e8._12_4_ = local_268._12_4_;
  local_2d8 = (float)local_258;
  local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  local_1f8.type = TYPE_MAT3;
  local_1f8.value.m_data[0] = (float)local_2f8._0_4_;
  local_1f8.value.m_data[1] = (float)local_2f8._4_4_;
  local_1f8.value.m_data[2] = (float)uStack_2f0;
  local_1f8.value.m_data[3] = uStack_2f0._4_4_;
  local_1f8.value.m_data[4] = (float)local_2e8._M_allocated_capacity._0_4_;
  local_1f8.value.m_data[5] = (float)local_2e8._M_allocated_capacity._4_4_;
  local_1f8.value.m_data[6] = (float)local_2e8._8_4_;
  local_1f8.value.m_data[7] = (float)local_2e8._12_4_;
  local_1f8.value.m_data[8] = local_2d8;
  local_1f8.value.m_data[9] = fStack_2d4;
  local_1f8.value.m_data[10] = fStack_2d0;
  local_1f8.value.m_data[0xb] = fStack_2cc;
  local_1f8.value.m_data[0xc] = local_2c8;
  local_1f8.value.m_data[0xd] = fStack_2c4;
  local_1f8.value.m_data[0xe] = (float)uStack_2c0;
  local_1f8.value.m_data[0xf] = (float)((ulong)uStack_2c0 >> 0x20);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)local_238,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
    operator_delete(local_1f8.name._M_dataplus._M_p,
                    (ulong)(local_1f8.name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_78,"u_texCoordMatrix0",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_238 + 0x18));
  puVar6 = local_278;
  local_248 = 0;
  uStack_240 = 0;
  local_258 = 0;
  uStack_250 = 0;
  local_268._M_allocated_capacity = 0;
  local_268._8_8_ = 0;
  local_278 = (undefined1  [8])0x0;
  uStack_270 = 0;
  lVar12 = 0;
  lVar10 = 0;
  do {
    lVar14 = 0;
    do {
      uVar17 = 0x3f800000;
      if (lVar12 != lVar14) {
        uVar17 = 0;
      }
      *(undefined4 *)(puVar6 + lVar14) = uVar17;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x40);
    lVar10 = lVar10 + 1;
    puVar6 = puVar6 + 4;
    lVar12 = lVar12 + 0x10;
  } while (lVar10 != 4);
  puVar6 = local_2f8;
  puVar11 = local_278;
  lVar12 = 0;
  do {
    lVar10 = 0;
    do {
      *(undefined4 *)(puVar6 + lVar10) = *(undefined4 *)(puVar11 + lVar10);
      lVar10 = lVar10 + 4;
    } while (lVar10 != 0x10);
    lVar12 = lVar12 + 1;
    puVar11 = puVar11 + 0x10;
    puVar6 = puVar6 + 0x10;
  } while (lVar12 != 4);
  local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,local_78._M_dataplus._M_p,
             local_78._M_dataplus._M_p + local_78._M_string_length);
  local_1f8.type = TYPE_MAT4;
  local_1f8.value.m_data[0] = (float)local_2f8._0_4_;
  local_1f8.value.m_data[1] = (float)local_2f8._4_4_;
  local_1f8.value.m_data[2] = (float)uStack_2f0;
  local_1f8.value.m_data[3] = uStack_2f0._4_4_;
  local_1f8.value.m_data[4] = (float)local_2e8._M_allocated_capacity._0_4_;
  local_1f8.value.m_data[5] = (float)local_2e8._M_allocated_capacity._4_4_;
  local_1f8.value.m_data[6] = (float)local_2e8._8_4_;
  local_1f8.value.m_data[7] = (float)local_2e8._12_4_;
  local_1f8.value.m_data[8] = local_2d8;
  local_1f8.value.m_data[9] = fStack_2d4;
  local_1f8.value.m_data[10] = fStack_2d0;
  local_1f8.value.m_data[0xb] = fStack_2cc;
  local_1f8.value.m_data[0xc] = local_2c8;
  local_1f8.value.m_data[0xd] = fStack_2c4;
  local_1f8.value.m_data[0xe] = (float)uStack_2c0;
  local_1f8.value.m_data[0xf] = (float)((ulong)uStack_2c0 >> 0x20);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)local_238,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
    operator_delete(local_1f8.name._M_dataplus._M_p,
                    (ulong)(local_1f8.name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                 "u_sampler0",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_238 + 0x18));
  local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,local_278,(char *)((long)local_278 + uStack_270));
  local_1f8.type = TYPE_TEXTURE_UNIT;
  local_1f8.value.m_data[0] = 0.0;
  local_1f8.value.m_data[1] = 0.0;
  local_1f8.value.m_data[2] = 0.0;
  local_1f8.value.m_data[3] = 0.0;
  local_1f8.value.m_data[4] = 0.0;
  local_1f8.value.m_data[5] = 0.0;
  local_1f8.value.m_data[6] = 0.0;
  local_1f8.value.m_data[7] = 0.0;
  local_1f8.value.m_data[8] = 0.0;
  local_1f8.value.m_data[9] = 0.0;
  local_1f8.value.m_data[10] = 0.0;
  local_1f8.value.m_data[0xb] = 0.0;
  local_1f8.value.m_data[0xc] = 0.0;
  local_1f8.value.m_data[0xd] = 0.0;
  local_1f8.value.m_data[0xe] = 0.0;
  local_1f8.value.m_data[0xf] = 0.0;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)local_238,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
    operator_delete(local_1f8.name._M_dataplus._M_p,
                    (ulong)(local_1f8.name.field_2._M_allocated_capacity + 1));
  }
  if (local_278 != (undefined1  [8])&local_268) {
    operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
  }
  local_1f8.name._M_dataplus._M_p =
       (pointer)(pPVar3->uniforms).
                super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_1f8.name._M_string_length =
       (size_type)
       (pPVar3->uniforms).
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1f8.name.field_2._M_allocated_capacity =
       (size_type)
       (pPVar3->uniforms).
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pPVar3->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_238._0_8_;
  (pPVar3->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_238._8_8_;
  (pPVar3->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_238._16_8_;
  local_238._0_8_ = (pointer)0x0;
  local_238._8_8_ = (pointer)0x0;
  local_238._16_8_ = 0;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
             *)&local_1f8);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
             *)local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._24_8_ != &local_210) {
    operator_delete((void *)local_238._24_8_,local_210._M_allocated_capacity + 1);
  }
  return pPVar3;
}

Assistant:

ShaderCompilerCase::ProgramContext ShaderCompilerLightCase::generateShaderData (int measurementNdx) const
{
	deUint32		specID		= getSpecializationID(measurementNdx);
	string			nameSpec	= getNameSpecialization(specID);
	ProgramContext	result;

	result.vertShaderSource		= specializeShaderSource(lightVertexTemplate(m_numLights, m_isVertexCase, m_lightType), specID, SHADER_VALIDITY_VALID);
	result.fragShaderSource		= specializeShaderSource(lightFragmentTemplate(m_numLights, m_isVertexCase, m_lightType), specID, SHADER_VALIDITY_VALID);
	result.vertexAttributes		= lightShaderAttributes(nameSpec);
	result.uniforms				= lightShaderUniforms(nameSpec, m_numLights, m_lightType);

	return result;
}